

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHaig.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkHaigRecreateAig(Abc_Ntk_t *pNtk,Hop_Man_t *p)

{
  long *plVar1;
  Abc_Obj_t *pOld;
  int iVar2;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar3;
  void *pvVar4;
  void *pvVar5;
  long *plVar6;
  int iVar7;
  Abc_Obj_t *pAVar8;
  
  if (p->nCreated != p->vObjs->nSize) {
    __assert_fail("p->nCreated == Vec_PtrSize(p->vObjs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcHaig.c"
                  ,0x15e,"Abc_Ntk_t *Abc_NtkHaigRecreateAig(Abc_Ntk_t *, Hop_Man_t *)");
  }
  pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
  pAVar3 = Abc_AigConst1(pNtk_00);
  (p->pConst1->field_1).pNext = (Hop_Obj_t *)pAVar3;
  for (iVar7 = 0; iVar7 < p->vPis->nSize; iVar7 = iVar7 + 1) {
    pvVar4 = Vec_PtrEntry(p->vPis,iVar7);
    pvVar5 = Vec_PtrEntry(pNtk_00->vCis,iVar7);
    *(void **)((long)pvVar4 + 8) = pvVar5;
  }
  for (iVar7 = 0; iVar7 < p->vObjs->nSize; iVar7 = iVar7 + 1) {
    pvVar4 = Vec_PtrEntry(p->vObjs,iVar7);
    if ((*(uint *)((long)pvVar4 + 0x20) & 6) == 4) {
      pAVar3 = Abc_AigAnd((Abc_Aig_t *)pNtk_00->pManFunc,
                          (Abc_Obj_t *)
                          ((ulong)((uint)*(ulong *)((long)pvVar4 + 0x10) & 1) ^
                          *(ulong *)((*(ulong *)((long)pvVar4 + 0x10) & 0xfffffffffffffffe) + 8)),
                          (Abc_Obj_t *)
                          ((ulong)((uint)*(ulong *)((long)pvVar4 + 0x18) & 1) ^
                          *(ulong *)((*(ulong *)((long)pvVar4 + 0x18) & 0xfffffffffffffffe) + 8)));
      *(Abc_Obj_t **)((long)pvVar4 + 8) = pAVar3;
      if (((ulong)pAVar3 & 1) != 0) {
        __assert_fail("!Hop_IsComplement(pObj->pNext)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcHaig.c"
                      ,0x16e,"Abc_Ntk_t *Abc_NtkHaigRecreateAig(Abc_Ntk_t *, Hop_Man_t *)");
      }
    }
  }
  for (iVar7 = 0; iVar7 < pNtk->vCos->nSize; iVar7 = iVar7 + 1) {
    pvVar4 = Vec_PtrEntry(pNtk->vCos,iVar7);
    pAVar3 = *(Abc_Obj_t **)((long)pvVar4 + 0x40);
    pvVar4 = Vec_PtrEntry(p->vPos,iVar7);
    Abc_ObjAddFanin(pAVar3,(Abc_Obj_t *)
                           ((ulong)((uint)*(ulong *)((long)pvVar4 + 0x10) & 1) ^
                           *(ulong *)((*(ulong *)((long)pvVar4 + 0x10) & 0xfffffffffffffffe) + 8)));
  }
  iVar7 = 0;
  do {
    if (p->vObjs->nSize <= iVar7) {
      iVar7 = Abc_NtkCheck(pNtk_00);
      if (iVar7 == 0) {
        puts("Abc_NtkHaigUse: The network check has failed.");
        Abc_NtkDelete(pNtk_00);
        pNtk_00 = (Abc_Ntk_t *)0x0;
      }
      return pNtk_00;
    }
    plVar6 = (long *)Vec_PtrEntry(p->vObjs,iVar7);
    plVar1 = (long *)*plVar6;
    if ((plVar1 != plVar6 && plVar1 != (long *)0x0) && ((*(uint *)(plVar1 + 4) & 6) == 4)) {
      pAVar3 = (Abc_Obj_t *)plVar6[1];
      if ((pAVar3->field_5).pData != (void *)0x0) {
        __assert_fail("pObjAbcThis->pData == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcHaig.c"
                      ,0x185,"Abc_Ntk_t *Abc_NtkHaigRecreateAig(Abc_Ntk_t *, Hop_Man_t *)");
      }
      if ((pAVar3->vFanouts).nSize != 0) {
        __assert_fail("Abc_ObjFanoutNum(pObjAbcThis) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcHaig.c"
                      ,0x187,"Abc_Ntk_t *Abc_NtkHaigRecreateAig(Abc_Ntk_t *, Hop_Man_t *)");
      }
      pOld = (Abc_Obj_t *)plVar1[1];
      if (pOld == pAVar3) {
        __assert_fail("pObjAbcRepr != pObjAbcThis",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcHaig.c"
                      ,0x189,"Abc_Ntk_t *Abc_NtkHaigRecreateAig(Abc_Ntk_t *, Hop_Man_t *)");
      }
      iVar2 = Abc_NtkHaigCheckTfi(pNtk_00,pOld,pAVar3);
      if (iVar2 == 0) {
        do {
          pAVar8 = pOld;
          pOld = (Abc_Obj_t *)(pAVar8->field_5).pData;
        } while (pOld != (Abc_Obj_t *)0x0);
        (pAVar8->field_5).pData = pAVar3;
      }
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

Abc_Ntk_t * Abc_NtkHaigRecreateAig( Abc_Ntk_t * pNtk, Hop_Man_t * p )
{
    Abc_Ntk_t * pNtkAig;
    Abc_Obj_t * pObjOld, * pObjAbcThis, * pObjAbcRepr;
    Hop_Obj_t * pObj;
    int i;
    assert( p->nCreated == Vec_PtrSize(p->vObjs) );

    // start the new network
    pNtkAig = Abc_NtkStartFrom( pNtk, ABC_NTK_STRASH, ABC_FUNC_AIG );

    // transfer new nodes to the PIs of HOP
    Hop_ManConst1(p)->pNext = (Hop_Obj_t *)Abc_AigConst1( pNtkAig );
    Hop_ManForEachPi( p, pObj, i )
        pObj->pNext = (Hop_Obj_t *)Abc_NtkCi( pNtkAig, i );

    // construct new nodes
    Vec_PtrForEachEntry( Hop_Obj_t *, p->vObjs, pObj, i )
    {
        if ( !Hop_ObjIsNode(pObj) )
            continue;
        pObj->pNext = (Hop_Obj_t *)Abc_AigAnd( (Abc_Aig_t *)pNtkAig->pManFunc, Hop_ObjChild0Next(pObj), Hop_ObjChild1Next(pObj) );
        assert( !Hop_IsComplement(pObj->pNext) );
    }

    // set the COs
    Abc_NtkForEachCo( pNtk, pObjOld, i )
        Abc_ObjAddFanin( pObjOld->pCopy, Hop_ObjChild0Next(Hop_ManPo(p,i)) );

    // construct choice nodes
    Vec_PtrForEachEntry( Hop_Obj_t *, p->vObjs, pObj, i )
    {
        // skip the node without choices
        if ( pObj->pData == NULL )
            continue;
        // skip the representative of the class
        if ( pObj->pData == pObj )
            continue;
        // do not create choices for constant 1 and PIs
        if ( !Hop_ObjIsNode((Hop_Obj_t *)pObj->pData) )
            continue;
        // get the corresponding new nodes
        pObjAbcThis = (Abc_Obj_t *)pObj->pNext;
        pObjAbcRepr = (Abc_Obj_t *)((Hop_Obj_t *)pObj->pData)->pNext;
        // the new node cannot be already in the class
        assert( pObjAbcThis->pData == NULL );
        // the new node cannot have fanouts
        assert( Abc_ObjFanoutNum(pObjAbcThis) == 0 );
        // these should be different nodes
        assert( pObjAbcRepr != pObjAbcThis );
        // do not create choices if there is a path from pObjAbcThis to pObjAbcRepr
        if ( !Abc_NtkHaigCheckTfi( pNtkAig, pObjAbcRepr, pObjAbcThis ) )
        {
            // find the last node in the class
            while ( pObjAbcRepr->pData )
                pObjAbcRepr = (Abc_Obj_t *)pObjAbcRepr->pData;
            // add the new node at the end of the list
            pObjAbcRepr->pData = pObjAbcThis;
        }
    }

    // finish the new network
//    Abc_NtkFinalize( pNtk, pNtkAig );
//    Abc_AigCleanup( pNtkAig->pManFunc );
    // check correctness of the network
    if ( !Abc_NtkCheck( pNtkAig ) )
    {
        printf( "Abc_NtkHaigUse: The network check has failed.\n" );
        Abc_NtkDelete( pNtkAig );
        return NULL;
    }
    return pNtkAig;
}